

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.cc
# Opt level: O0

void OPENSSL_sk_pop_free_ex
               (OPENSSL_STACK *sk,OPENSSL_sk_call_free_func call_free_func,
               OPENSSL_sk_free_func free_func)

{
  ulong local_28;
  size_t i;
  OPENSSL_sk_free_func free_func_local;
  OPENSSL_sk_call_free_func call_free_func_local;
  OPENSSL_STACK *sk_local;
  
  if (sk != (OPENSSL_STACK *)0x0) {
    for (local_28 = 0; local_28 < sk->num; local_28 = local_28 + 1) {
      if (sk->data[local_28] != (void *)0x0) {
        (*call_free_func)(free_func,sk->data[local_28]);
      }
    }
    OPENSSL_sk_free(sk);
  }
  return;
}

Assistant:

void OPENSSL_sk_pop_free_ex(OPENSSL_STACK *sk,
                            OPENSSL_sk_call_free_func call_free_func,
                            OPENSSL_sk_free_func free_func) {
  if (sk == NULL) {
    return;
  }

  for (size_t i = 0; i < sk->num; i++) {
    if (sk->data[i] != NULL) {
      call_free_func(free_func, sk->data[i]);
    }
  }
  OPENSSL_sk_free(sk);
}